

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  byte bVar1;
  TValue *pTVar2;
  TValue k;
  Value local_20;
  undefined1 local_18;
  
  pTVar2 = index2value(L,idx);
  local_18 = 2;
  local_20.p = p;
  bVar1 = luaH_get((Table *)(pTVar2->value_).gc,(TValue *)&local_20,&((L->top).p)->val);
  if ((bVar1 & 0xf) == 0) {
    *(undefined1 *)((L->top).offset + 8) = 0;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return (int)(bVar1 & 0xf);
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  Table *t;
  TValue k;
  lua_lock(L);
  t = gettable(L, idx);
  setpvalue(&k, cast_voidp(p));
  return finishrawget(L, luaH_get(t, &k, s2v(L->top.p)));
}